

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O0

void __thiscall
amrex::PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
          (PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *this,size_type a_new_size)

{
  size_type sVar1;
  ulong in_RSI;
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_RDI;
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *unaff_retaddr;
  size_type in_stack_00000008;
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_00000010;
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *a_num_to_be_added;
  
  a_num_to_be_added = in_RDI;
  sVar1 = capacity(in_RDI);
  if (sVar1 < in_RSI) {
    capacity(in_RDI);
    GetNewCapacity(unaff_retaddr,(size_type)a_num_to_be_added);
    AllocateBuffer(in_stack_00000010,in_stack_00000008);
  }
  in_RDI->m_size = in_RSI;
  return;
}

Assistant:

void resize (size_type a_new_size) noexcept
        {
            if (capacity() < a_new_size) AllocateBuffer(GetNewCapacity(a_new_size - capacity()));
            m_size = a_new_size;
        }